

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarTypeUtil.cpp
# Opt level: O3

void glu::parseTypePath(char *nameWithPath,VarType *type,TypeComponentVector *path)

{
  pointer pVVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  TestError *pTVar5;
  Token TVar6;
  long lVar7;
  __normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
  in_R8;
  VarTokenizer tokenizer;
  string memberName;
  VarType curType;
  VarTokenizer local_90;
  VarTypeComponent local_78 [2];
  long local_68 [2];
  VarType local_58;
  VarTypeComponent local_40;
  VarType *local_38;
  
  local_90.m_token = TOKEN_LAST;
  local_90.m_tokenStart = 0;
  local_90.m_tokenLen = 0;
  local_90.m_str = nameWithPath;
  local_38 = type;
  VarTokenizer::advance(&local_90);
  if (local_90.m_token == TOKEN_IDENTIFIER) {
    VarTokenizer::advance(&local_90);
  }
  pVVar1 = (path->super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  if ((path->super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>).
      _M_impl.super__Vector_impl_data._M_finish != pVVar1) {
    (path->super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>).
    _M_impl.super__Vector_impl_data._M_finish = pVVar1;
  }
  if (local_90.m_token != TOKEN_END) {
    TVar6 = local_90.m_token;
    do {
      getVarType<__gnu_cxx::__normal_iterator<glu::VarTypeComponent_const*,std::vector<glu::VarTypeComponent,std::allocator<glu::VarTypeComponent>>>>
                (&local_58,(glu *)local_38,
                 (VarType *)
                 (path->
                 super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>).
                 _M_impl.super__Vector_impl_data._M_start,
                 (path->
                 super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>).
                 _M_impl.super__Vector_impl_data._M_finish,in_R8);
      if (TVar6 == TOKEN_LEFT_BRACKET) {
        VarTokenizer::advance(&local_90);
        if (local_90.m_token != TOKEN_NUMBER) {
          pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar5,(char *)0x0,"tokenizer.getToken() == VarTokenizer::TOKEN_NUMBER",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluVarTypeUtil.cpp"
                     ,0x83);
          goto LAB_009bc8df;
        }
        iVar3 = VarTokenizer::getNumber(&local_90);
        if (local_58.m_type == TYPE_BASIC) {
          if (local_58.m_data.basic.type - TYPE_FLOAT_MAT2 < 9 ||
              local_58.m_data.basic.type - TYPE_DOUBLE_MAT2 < 9) {
            iVar4 = getDataTypeMatrixNumColumns(local_58.m_data.basic.type);
            if ((iVar3 < 0) || (iVar4 <= iVar3)) {
              pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (pTVar5,(char *)0x0,
                         "de::inBounds(ndx, 0, getDataTypeMatrixNumColumns(curType.getBasicType()))"
                         ,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluVarTypeUtil.cpp"
                         ,0x8e);
              goto LAB_009bc97a;
            }
            local_78[0].index = iVar3;
            local_78[0].type = MATRIX_COLUMN;
            std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::
            emplace_back<glu::VarTypeComponent>(path,local_78);
          }
          else {
            if (((TYPE_UINT_VEC4 < local_58.m_data.basic.type) ||
                ((0x77003801cU >> ((ulong)local_58.m_data.basic.type & 0x3f) & 1) == 0)) &&
               (2 < local_58.m_data.basic.type - TYPE_BOOL_VEC2)) goto LAB_009bc77c;
            iVar4 = getDataTypeScalarSize(local_58.m_data.basic.type);
            if ((iVar3 < 0) || (iVar4 <= iVar3)) {
              pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (pTVar5,(char *)0x0,
                         "de::inBounds(ndx, 0, getDataTypeScalarSize(curType.getBasicType()))",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluVarTypeUtil.cpp"
                         ,0x93);
              goto LAB_009bc97a;
            }
            local_78[0].index = iVar3;
            local_78[0].type = VECTOR_COMPONENT;
            std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::
            emplace_back<glu::VarTypeComponent>(path,local_78);
          }
        }
        else {
          if (local_58.m_type != TYPE_ARRAY) {
LAB_009bc77c:
            pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar5,"Invalid subscript",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluVarTypeUtil.cpp"
                       ,0x97);
            goto LAB_009bc97a;
          }
          if ((iVar3 < 0) || (local_58.m_data.array.size <= iVar3)) {
            pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar5,(char *)0x0,"de::inBounds(ndx, 0, curType.getArraySize())",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluVarTypeUtil.cpp"
                       ,0x89);
            goto LAB_009bc97a;
          }
          local_78[0].index = iVar3;
          local_78[0].type = ARRAY_ELEMENT;
          std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::
          emplace_back<glu::VarTypeComponent>(path,local_78);
        }
        VarTokenizer::advance(&local_90);
        if (local_90.m_token != TOKEN_RIGHT_BRACKET) {
          pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar5,(char *)0x0,"tokenizer.getToken() == VarTokenizer::TOKEN_RIGHT_BRACKET",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluVarTypeUtil.cpp"
                     ,0x9a);
LAB_009bc97a:
          __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        VarTokenizer::advance(&local_90);
      }
      else {
        if (TVar6 != TOKEN_PERIOD) {
          pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar5,"Unexpected token",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluVarTypeUtil.cpp"
                     ,0x9e);
LAB_009bc8df:
          __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        VarTokenizer::advance(&local_90);
        if (local_90.m_token != TOKEN_IDENTIFIER) {
          pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar5,(char *)0x0,"tokenizer.getToken() == VarTokenizer::TOKEN_IDENTIFIER",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluVarTypeUtil.cpp"
                     ,0x70);
          goto LAB_009bc8df;
        }
        if (local_58.m_type != TYPE_STRUCT) {
          pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar5,"Invalid field selector","curType.isStructType()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluVarTypeUtil.cpp"
                     ,0x71);
          goto LAB_009bc8df;
        }
        local_78[0] = (VarTypeComponent)local_68;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_78,local_90.m_str + local_90.m_tokenStart,
                   local_90.m_str + local_90.m_tokenStart + local_90.m_tokenLen);
        iVar3 = (int)((ulong)(*(long *)(CONCAT44(local_58.m_data.basic.precision,
                                                 local_58.m_data.basic.type) + 0x28) -
                             *(long *)(CONCAT44(local_58.m_data.basic.precision,
                                                local_58.m_data.basic.type) + 0x20)) >> 3) *
                -0x49249249;
        if (iVar3 < 1) {
          iVar4 = 0;
        }
        else {
          lVar7 = 0;
          do {
            iVar3 = std::__cxx11::string::compare((char *)local_78);
            lVar2 = CONCAT44(local_58.m_data.basic.precision,local_58.m_data.basic.type);
            if (iVar3 == 0) {
              iVar3 = (int)(*(long *)(lVar2 + 0x28) - *(long *)(lVar2 + 0x20) >> 3) * -0x49249249;
              break;
            }
            lVar7 = lVar7 + 1;
            iVar3 = (int)(*(long *)(lVar2 + 0x28) - *(long *)(lVar2 + 0x20) >> 3) * -0x49249249;
          } while (lVar7 < iVar3);
          iVar4 = (int)lVar7;
        }
        if (iVar3 <= iVar4) {
          pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar5,"Member not found in type",
                     "ndx < curType.getStructPtr()->getNumMembers()",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluVarTypeUtil.cpp"
                     ,0x7b);
          __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        local_40.type = STRUCT_MEMBER;
        local_40.index = iVar4;
        std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>::
        emplace_back<glu::VarTypeComponent>(path,&local_40);
        VarTokenizer::advance(&local_90);
        if (local_78[0] != (VarTypeComponent)local_68) {
          operator_delete((void *)local_78[0],local_68[0] + 1);
        }
      }
      VarType::~VarType(&local_58);
      TVar6 = local_90.m_token;
    } while (local_90.m_token != TOKEN_END);
  }
  return;
}

Assistant:

void parseTypePath (const char* nameWithPath, const VarType& type, TypeComponentVector& path)
{
	VarTokenizer tokenizer(nameWithPath);

	if (tokenizer.getToken() == VarTokenizer::TOKEN_IDENTIFIER)
		tokenizer.advance();

	path.clear();
	while (tokenizer.getToken() != VarTokenizer::TOKEN_END)
	{
		VarType curType = getVarType(type, path);

		if (tokenizer.getToken() == VarTokenizer::TOKEN_PERIOD)
		{
			tokenizer.advance();
			TCU_CHECK(tokenizer.getToken() == VarTokenizer::TOKEN_IDENTIFIER);
			TCU_CHECK_MSG(curType.isStructType(), "Invalid field selector");

			// Find member.
			std::string		memberName	= tokenizer.getIdentifier();
			int				ndx			= 0;
			for (; ndx < curType.getStructPtr()->getNumMembers(); ndx++)
			{
				if (memberName == curType.getStructPtr()->getMember(ndx).getName())
					break;
			}
			TCU_CHECK_MSG(ndx < curType.getStructPtr()->getNumMembers(), "Member not found in type");

			path.push_back(VarTypeComponent(VarTypeComponent::STRUCT_MEMBER, ndx));
			tokenizer.advance();
		}
		else if (tokenizer.getToken() == VarTokenizer::TOKEN_LEFT_BRACKET)
		{
			tokenizer.advance();
			TCU_CHECK(tokenizer.getToken() == VarTokenizer::TOKEN_NUMBER);

			int ndx = tokenizer.getNumber();

			if (curType.isArrayType())
			{
				TCU_CHECK(de::inBounds(ndx, 0, curType.getArraySize()));
				path.push_back(VarTypeComponent(VarTypeComponent::ARRAY_ELEMENT, ndx));
			}
			else if (curType.isBasicType() && isDataTypeMatrix(curType.getBasicType()))
			{
				TCU_CHECK(de::inBounds(ndx, 0, getDataTypeMatrixNumColumns(curType.getBasicType())));
				path.push_back(VarTypeComponent(VarTypeComponent::MATRIX_COLUMN, ndx));
			}
			else if (curType.isBasicType() && isDataTypeVector(curType.getBasicType()))
			{
				TCU_CHECK(de::inBounds(ndx, 0, getDataTypeScalarSize(curType.getBasicType())));
				path.push_back(VarTypeComponent(VarTypeComponent::VECTOR_COMPONENT, ndx));
			}
			else
				TCU_FAIL("Invalid subscript");

			tokenizer.advance();
			TCU_CHECK(tokenizer.getToken() == VarTokenizer::TOKEN_RIGHT_BRACKET);
			tokenizer.advance();
		}
		else
			TCU_FAIL("Unexpected token");
	}
}